

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf_impl.cpp
# Opt level: O2

int32_t utf8_back1SafeBody_63(uint8_t *s,int32_t start,int32_t i)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int32_t orig_i;
  byte *pbVar5;
  uint uVar6;
  
  bVar1 = s[i];
  if (i <= start || -0x41 < (char)bVar1) {
    return i;
  }
  iVar4 = i + -1;
  bVar2 = s[(long)i + -1];
  if ((byte)(bVar2 + 0x3e) < 0x33) {
    if (bVar2 < 0xe0) {
      return iVar4;
    }
    if (bVar2 < 0xf0) {
      pbVar5 = (byte *)(" 000000000000\x1000" + (bVar2 & 0xf));
      uVar6 = (uint)(bVar1 >> 5);
    }
    else {
      pbVar5 = (byte *)("" + (bVar1 >> 4));
      uVar6 = bVar2 & 7;
    }
    bVar1 = *pbVar5 >> uVar6;
  }
  else {
    if (iVar4 <= start || -0x41 < (char)bVar2) {
      return i;
    }
    iVar4 = i + -2;
    bVar1 = s[(long)i + -2];
    if (0x14 < (byte)(bVar1 + 0x20)) {
      if (iVar4 <= start || -0x41 < (char)bVar1) {
        return i;
      }
      if (4 < (byte)(s[(long)i + -3] + 0x10)) {
        return i;
      }
      if (((byte)""[bVar1 >> 4] >> (s[(long)i + -3] & 7) & 1) == 0) {
        return i;
      }
      return i + -3;
    }
    pbVar5 = (byte *)("" + (bVar2 >> 4));
    if (bVar1 < 0xf0) {
      pbVar5 = (byte *)(" 000000000000\x1000" + (bVar1 & 0xf));
    }
    bVar3 = bVar1 & 7;
    if (bVar1 < 0xf0) {
      bVar3 = bVar2 >> 5;
    }
    bVar1 = *pbVar5 >> bVar3;
  }
  if ((bVar1 & 1) == 0) {
    return i;
  }
  return iVar4;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utf8_back1SafeBody(const uint8_t *s, int32_t start, int32_t i) {
    // Same as utf8_prevCharSafeBody(..., strict=-1) minus assembling code points.
    int32_t orig_i=i;
    uint8_t c=s[i];
    if(U8_IS_TRAIL(c) && i>start) {
        uint8_t b1=s[--i];
        if(U8_IS_LEAD(b1)) {
            if(b1<0xe0 ||
                    (b1<0xf0 ? U8_IS_VALID_LEAD3_AND_T1(b1, c) : U8_IS_VALID_LEAD4_AND_T1(b1, c))) {
                return i;
            }
        } else if(U8_IS_TRAIL(b1) && i>start) {
            uint8_t b2=s[--i];
            if(0xe0<=b2 && b2<=0xf4) {
                if(b2<0xf0 ? U8_IS_VALID_LEAD3_AND_T1(b2, b1) : U8_IS_VALID_LEAD4_AND_T1(b2, b1)) {
                    return i;
                }
            } else if(U8_IS_TRAIL(b2) && i>start) {
                uint8_t b3=s[--i];
                if(0xf0<=b3 && b3<=0xf4 && U8_IS_VALID_LEAD4_AND_T1(b3, b2)) {
                    return i;
                }
            }
        }
    }
    return orig_i;
}